

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O0

void convert_index(dmr_C *C,expression *e)

{
  int iVar1;
  uint uVar2;
  string *psVar3;
  int iVar4;
  uint to;
  uint from;
  expression *child;
  expression *e_local;
  dmr_C *C_local;
  
  psVar3 = (e->field_5).field_2.string;
  iVar1 = (e->field_5).field_2.wide;
  uVar2 = (e->field_5).field_15.idx_to;
  *(ushort *)e = *(ushort *)e & 0xff00 | 0x1b;
  iVar4 = dmrC_bits_to_bytes(C->target,(e->ctype->field_14).field_1.normal);
  (e->field_5).field_2.wide = iVar1 * iVar4;
  (e->field_5).field_15.idx_to = (uVar2 + 1) - iVar1;
  (e->field_5).field_2.string = psVar3;
  return;
}

Assistant:

static void convert_index(struct dmr_C *C, struct expression *e)
{
	struct expression *child = e->idx_expression;
	unsigned from = e->idx_from;
	unsigned to = e->idx_to + 1;
	e->type = EXPR_POS;
	e->init_offset = from * dmrC_bits_to_bytes(C->target, e->ctype->bit_size);
	e->init_nr = to - from;
	e->init_expr = child;
}